

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fire_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Fire_PDU::Fire_PDU
          (Fire_PDU *this,EntityIdentifier *FiringEntID,EntityIdentifier *TargetEntID,
          EntityIdentifier *MunitionID,EntityIdentifier *EventID,KUINT32 FireMissionIndex,
          WorldCoordinates *Location,DescPtr *Desc,Vector *Velocity,KFLOAT32 Range)

{
  KRef_Ptr<KDIS::DATA_TYPE::Descriptor> local_60;
  KFLOAT32 local_38;
  KUINT32 local_34;
  KFLOAT32 Range_local;
  KUINT32 FireMissionIndex_local;
  EntityIdentifier *EventID_local;
  EntityIdentifier *MunitionID_local;
  EntityIdentifier *TargetEntID_local;
  EntityIdentifier *FiringEntID_local;
  Fire_PDU *this_local;
  
  local_38 = Range;
  local_34 = FireMissionIndex;
  _Range_local = EventID;
  EventID_local = MunitionID;
  MunitionID_local = TargetEntID;
  TargetEntID_local = FiringEntID;
  FiringEntID_local = (EntityIdentifier *)this;
  Warfare_Header::Warfare_Header
            (&this->super_Warfare_Header,FiringEntID,TargetEntID,MunitionID,EventID);
  (this->super_Warfare_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Fire_PDU_0032f4f8;
  this->m_ui32FireMissionIndex = local_34;
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_Location,Location);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&this->m_pDescriptor);
  DATA_TYPE::Vector::Vector(&this->m_Velocity,Velocity);
  this->m_f32Range = local_38;
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui8PDUType = '\x02';
  (this->super_Warfare_Header).super_Header.super_Header6.m_ui16PDULength = 0x60;
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::KRef_Ptr(&local_60,Desc);
  SetDescriptor(this,&local_60);
  UTILS::KRef_Ptr<KDIS::DATA_TYPE::Descriptor>::~KRef_Ptr(&local_60);
  return;
}

Assistant:

Fire_PDU::Fire_PDU( const EntityIdentifier & FiringEntID, const EntityIdentifier & TargetEntID, const EntityIdentifier & MunitionID,
                    const EntityIdentifier & EventID, KUINT32 FireMissionIndex, const WorldCoordinates & Location,
                    DescPtr Desc, const Vector & Velocity, KFLOAT32 Range ) :
    Warfare_Header( FiringEntID, TargetEntID, MunitionID, EventID ),
    m_ui32FireMissionIndex( FireMissionIndex ),
    m_Location( Location ),
    m_Velocity( Velocity ),
    m_f32Range( Range )
{
    m_ui8PDUType = Fire_PDU_Type;
    m_ui16PDULength = FIRE_PDU_SIZE;
    SetDescriptor( Desc );
}